

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__texture3D_enable
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  xmlChar **ppxVar1;
  ParserChar *text;
  ParserChar *buffer;
  bool bVar2;
  undefined8 in_RAX;
  byte *pbVar3;
  code *pcVar4;
  uint64 uVar5;
  bool failed_1;
  bool failed;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pbVar3 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x18);
  pbVar3[0] = 0;
  pbVar3[1] = 0;
  pbVar3[2] = 0;
  pbVar3[3] = 0;
  pbVar3[4] = 0;
  pbVar3[5] = 0;
  pbVar3[6] = 0;
  pbVar3[7] = 0;
  pbVar3[8] = 0;
  pbVar3[9] = 0;
  pbVar3[10] = 0;
  pbVar3[0xb] = 0;
  pbVar3[0xc] = 0;
  pbVar3[0xd] = 0;
  pbVar3[0xe] = 0;
  pbVar3[0xf] = 0;
  pbVar3[0x10] = 0;
  pbVar3[0x11] = 0;
  pbVar3[0x12] = 0;
  pbVar3[0x13] = 0;
  pbVar3[0x14] = 0;
  pbVar3[0x15] = 0;
  pbVar3[0x16] = 0;
  pbVar3[0x17] = 0;
  *attributeDataPtr = pbVar3;
  ppxVar1 = attributes->attributes;
  if (ppxVar1 != (xmlChar **)0x0) {
    text = *ppxVar1;
    while (text != (ParserChar *)0x0) {
      pcVar4 = (code *)GeneratedSaxParser::Utils::calculateStringHash(text);
      buffer = ppxVar1[1];
      if (pcVar4 == _end__render__instance_material) {
        uVar5 = GeneratedSaxParser::Utils::toUint64(buffer,(bool *)((long)&uStack_38 + 6));
        *(uint64 *)(pbVar3 + 0x10) = uVar5;
        if (uStack_38._6_1_ == 1) {
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0xe8b5455,0x704ac8,buffer);
          if (bVar2) {
            return false;
          }
        }
        if ((uStack_38._6_1_ & 1) == 0) {
          *pbVar3 = *pbVar3 | 1;
        }
      }
      else if (pcVar4 == (code *)0x76887d) {
        *(ParserChar **)(pbVar3 + 8) = buffer;
      }
      else {
        if (pcVar4 == (code *)0x7c83b5) {
          bVar2 = GeneratedSaxParser::Utils::toBool(buffer,(bool *)((long)&uStack_38 + 7));
          pbVar3[4] = bVar2;
          if (uStack_38._7_1_ != '\x01') goto LAB_00718f67;
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0xe8b5455,0x7c83b5,buffer);
        }
        else {
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0xe8b5455,text,buffer);
        }
        if (bVar2 != false) {
          return false;
        }
      }
LAB_00718f67:
      text = ppxVar1[2];
      ppxVar1 = ppxVar1 + 2;
    }
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__texture3D_enable( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__texture3D_enable( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

texture3D_enable__AttributeData* attributeData = newData<texture3D_enable__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_VALUE:
    {
bool failed;
attributeData->value = GeneratedSaxParser::Utils::toBool(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_TEXTURE3D_ENABLE,
        HASH_ATTRIBUTE_VALUE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_PARAM:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_TEXTURE3D_ENABLE,
            HASH_ATTRIBUTE_PARAM,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_INDEX:
    {
bool failed;
attributeData->index = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_TEXTURE3D_ENABLE,
        HASH_ATTRIBUTE_INDEX,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= texture3D_enable__AttributeData::ATTRIBUTE_INDEX_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_TEXTURE3D_ENABLE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}